

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O0

void __thiscall
OptionParser::parseOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  int iVar1;
  size_type sVar2;
  reference s;
  ulong uVar3;
  OptionParser local_108 [36];
  undefined4 local_e4;
  Utilities local_e0 [55];
  allocator local_a9;
  string local_a8 [8];
  string value;
  string local_88 [8];
  string keyword;
  string local_68 [8];
  string s2;
  string local_48 [8];
  string s1;
  string *tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Network *network_local;
  OptionParser *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  if (1 < sVar2) {
    s = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](tokenList,0);
    std::__cxx11::string::string(local_48);
    std::__cxx11::string::string(local_68);
    std::__cxx11::string::string(local_88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"",&local_a9);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    Utilities::upperCase(local_e0,s);
    std::__cxx11::string::operator=(local_48,(string *)local_e0);
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::operator=(local_68,(string *)(s + 0x20));
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(tokenList);
    if (sVar2 < 3) {
      std::__cxx11::string::operator=(local_a8,local_68);
    }
    else {
      std::__cxx11::string::operator=(local_a8,(string *)(s + 0x40));
    }
    iVar1 = Utilities::findFullMatch((string *)local_48,deprecatedKeywords);
    if (iVar1 < 0) {
      iVar1 = std::__cxx11::string::compare((char *)local_48);
      if (iVar1 == 0) {
        sVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(tokenList);
        if (sVar2 == 2) {
          std::__cxx11::string::operator=(local_a8,"");
        }
        parseQualOption(this,(string *)local_68,(string *)local_a8,network);
        local_e4 = 1;
      }
      else {
        getEpanet3Keyword(local_108,(string *)this,(string *)local_48,(string *)local_68);
        std::__cxx11::string::operator=(local_88,(string *)local_108);
        std::__cxx11::string::~string((string *)local_108);
        uVar3 = std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          setOption(this,(string *)local_88,(string *)local_a8,network);
        }
        local_e4 = 0;
      }
    }
    else {
      local_e4 = 1;
    }
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void OptionParser::parseOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens
    if ( tokenList.size() < 2 ) return;
    string* tokens = &tokenList[0];

    // ... parse option keywords
    string s1, s2, keyword;
    string value = "";
    s1 = Utilities::upperCase(tokens[0]);
    s2 = tokens[1];
    if ( tokenList.size() > 2 )
    {
        value = tokens[2];
    }
    else value = s2;

    // ... check for deprecated keywords
    if ( Utilities::findFullMatch(s1, deprecatedKeywords) >= 0 ) return;

    // ... check for EPANET2 "QUALITY" keyword which requires special processing
    if ( s1.compare(w_QUALITY) == 0 )
    {
        if ( tokenList.size() == 2 ) value = "";
        parseQualOption(s2, value, network);
        return;
    }

    // ... get the equivalent EPANET3 keyword
    keyword = getEpanet3Keyword(s1, s2, value);

    // ... set the appropriate option to the parsed value
    if ( !value.empty() ) setOption(keyword, value, network);
}